

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_7::TwoLevelIterator::SkipEmptyDataBlocksBackward(TwoLevelIterator *this)

{
  bool bVar1;
  Iterator *pIVar2;
  byte local_19;
  TwoLevelIterator *this_local;
  
  while( true ) {
    pIVar2 = IteratorWrapper::iter(&this->data_iter_);
    local_19 = 1;
    if (pIVar2 != (Iterator *)0x0) {
      bVar1 = IteratorWrapper::Valid(&this->data_iter_);
      local_19 = bVar1 ^ 0xff;
    }
    if ((local_19 & 1) == 0) break;
    bVar1 = IteratorWrapper::Valid(&this->index_iter_);
    if (!bVar1) {
      SetDataIterator(this,(Iterator *)0x0);
      return;
    }
    IteratorWrapper::Prev(&this->index_iter_);
    InitDataBlock(this);
    pIVar2 = IteratorWrapper::iter(&this->data_iter_);
    if (pIVar2 != (Iterator *)0x0) {
      IteratorWrapper::SeekToLast(&this->data_iter_);
    }
  }
  return;
}

Assistant:

void TwoLevelIterator::SkipEmptyDataBlocksBackward() {
  while (data_iter_.iter() == nullptr || !data_iter_.Valid()) {
    // Move to next block
    if (!index_iter_.Valid()) {
      SetDataIterator(nullptr);
      return;
    }
    index_iter_.Prev();
    InitDataBlock();
    if (data_iter_.iter() != nullptr) data_iter_.SeekToLast();
  }
}